

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.h
# Opt level: O2

string * __thiscall
pstack::stringify<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
          (string *__return_storage_ptr__,pstack *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *things,
          char (*things_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *things_2)

{
  ostream *poVar1;
  ostringstream local_1a8 [8];
  ostringstream stream;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,(string *)this);
  poVar1 = std::operator<<(poVar1,(char *)things);
  std::operator<<(poVar1,(string *)things_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
stringify(Stuff&&... things)
{
    std::ostringstream stream;
    ( stream <<  ... << things );
    return stream.str();
}